

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

bool __thiscall
dg::vr::ValueRelations::has<dg::vr::Bucket>(ValueRelations *this,Bucket *val,Relations rels)

{
  const_iterator cVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  key_type local_18;
  
  if ((((ulong)rels.bits.super__Base_bitset<1UL>._M_w & 1) != 0) &&
     (local_18._M_data = val,
     cVar1 = std::
             _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find(&(this->bucketToVals)._M_t,&local_18),
     8 < (ulong)((long)cVar1._M_node[1]._M_left - (long)cVar1._M_node[1]._M_parent))) {
    return true;
  }
  bVar4 = true;
  lVar2 = 0;
  while ((uVar3 = (ulong)*(uint *)((long)&Relations::all + lVar2),
         (((ulong)rels.bits.super__Base_bitset<1UL>._M_w & 0xfffffffffffffffe) >> (uVar3 & 0x3f) & 1
         ) == 0 || ((val->relatedBuckets)._M_elems[uVar3].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (val->relatedBuckets)._M_elems[uVar3].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish))) {
    lVar2 = lVar2 + 4;
    bVar4 = lVar2 != 0x30;
    if (!bVar4) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool has(const X &val, Relations rels) const {
        HandlePtr mVal = maybeGet(val);
        return mVal && ((rels.has(Relations::EQ) &&
                         bucketToVals.find(*mVal)->second.size() > 1) ||
                        mVal->hasAnyRelation(rels.set(Relations::EQ, false)));
    }